

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O0

bool duckdb::ConvertFloatingToUhugeint<long_double>(longdouble value,uhugeint_t *result)

{
  bool bVar1;
  unsigned_long uVar2;
  ulong *in_RDI;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  double dVar6;
  longdouble in_stack_00000008;
  bool local_1;
  
  bVar1 = Value::IsFinite<long_double>(in_stack_00000008);
  if (bVar1) {
    if ((in_stack_00000008 < (longdouble)0) ||
       ((longdouble)3.402823669209385e+38 <= in_stack_00000008)) {
      local_1 = false;
    }
    else {
      uVar2 = NumericLimits<unsigned_long>::Maximum();
      dVar6 = fmod((double)in_stack_00000008,
                   (double)(*(float *)(&DAT_02a62488 + (ulong)((long)uVar2 < 0) * 4) +
                           (float)(long)uVar2));
      *in_RDI = (long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f;
      uVar2 = NumericLimits<unsigned_long>::Maximum();
      lVar5 = in_stack_00000008 /
              ((longdouble)*(float *)(&DAT_02a62488 + (ulong)((long)uVar2 < 0) * 4) +
              (longdouble)(long)uVar2);
      lVar3 = (longdouble)9.223372e+18;
      lVar4 = (longdouble)0;
      if (lVar3 <= lVar5) {
        lVar4 = lVar3;
      }
      in_RDI[1] = (long)ROUND(lVar5 - lVar4) ^ (ulong)(lVar3 <= lVar5) << 0x3f;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ConvertFloatingToUhugeint(REAL_T value, uhugeint_t &result) {
	if (!Value::IsFinite<REAL_T>(value)) {
		return false;
	}
	if (value < 0 || value >= 340282366920938463463374607431768211456.0) {
		return false;
	}
	result.lower = (uint64_t)fmod(value, REAL_T(NumericLimits<uint64_t>::Maximum()));
	result.upper = (uint64_t)(value / REAL_T(NumericLimits<uint64_t>::Maximum()));
	return true;
}